

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O2

void __thiscall
chrono::ChLoadXYZnode::ChLoadXYZnode(ChLoadXYZnode *this,shared_ptr<chrono::ChNodeXYZ> *mloadable)

{
  __shared_ptr<chrono::ChLoadableUVW,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<chrono::ChLoadableUVW,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChNodeXYZ,void>
            (local_20,&mloadable->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>)
  ;
  ChLoad<chrono::ChLoaderXYZnode>::ChLoad
            (&this->super_ChLoad<chrono::ChLoaderXYZnode>,
             (shared_ptr<chrono::ChLoadableUVW> *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  (this->super_ChLoad<chrono::ChLoaderXYZnode>).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoad_01176a00;
  return;
}

Assistant:

ChLoadXYZnode(std::shared_ptr<ChNodeXYZ> mloadable) : ChLoad<ChLoaderXYZnode>(mloadable) {}